

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PagerSetBusyhandler
               (Pager *pPager,_func_int_void_ptr *xBusyHandler,void *pBusyHandlerArg)

{
  void **ap;
  void *pBusyHandlerArg_local;
  _func_int_void_ptr *xBusyHandler_local;
  Pager *pPager_local;
  
  pPager->xBusyHandler = xBusyHandler;
  pPager->pBusyHandlerArg = pBusyHandlerArg;
  if (pPager->fd->pMethods != (sqlite3_io_methods *)0x0) {
    sqlite3OsFileControlHint(pPager->fd,0xf,&pPager->xBusyHandler);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerSetBusyhandler(
  Pager *pPager,                       /* Pager object */
  int (*xBusyHandler)(void *),         /* Pointer to busy-handler function */
  void *pBusyHandlerArg                /* Argument to pass to xBusyHandler */
){
  pPager->xBusyHandler = xBusyHandler;
  pPager->pBusyHandlerArg = pBusyHandlerArg;

  if( isOpen(pPager->fd) ){
    void **ap = (void **)&pPager->xBusyHandler;
    assert( ((int(*)(void *))(ap[0]))==xBusyHandler );
    assert( ap[1]==pBusyHandlerArg );
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_BUSYHANDLER, (void *)ap);
  }
}